

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaLoader.cpp
# Opt level: O0

void __thiscall
Assimp::ColladaLoader::AddTexture
          (ColladaLoader *this,aiMaterial *mat,ColladaParser *pParser,Effect *effect,
          Sampler *sampler,aiTextureType type,uint idx)

{
  bool bVar1;
  reference pcVar2;
  Logger *this_00;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_450;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_448;
  const_iterator it;
  undefined1 local_438 [4];
  int map;
  aiString name;
  aiTextureType type_local;
  Sampler *sampler_local;
  Effect *effect_local;
  ColladaParser *pParser_local;
  aiMaterial *mat_local;
  ColladaLoader *this_local;
  
  name.data._1016_4_ = type;
  unique0x10000290 = sampler;
  FindFilenameForEffectTexture((aiString *)local_438,this,pParser,effect,&sampler->mName);
  aiMaterial::AddProperty(mat,(aiString *)local_438,"$tex.file",name.data._1016_4_,idx);
  it._M_current._5_3_ = 0;
  it._M_current._4_1_ = (stack0xffffffffffffffd0->mWrapU & 1U) == 0;
  if (((stack0xffffffffffffffd0->mWrapU & 1U) != 0) &&
     ((stack0xffffffffffffffd0->mMirrorU & 1U) != 0)) {
    it._M_current._4_4_ = 2;
  }
  aiMaterial::AddProperty
            (mat,(int *)((long)&it._M_current + 4),1,"$tex.mapmodeu",name.data._1016_4_,idx);
  it._M_current._5_3_ = 0;
  it._M_current._4_1_ = (stack0xffffffffffffffd0->mWrapV & 1U) == 0;
  if (((stack0xffffffffffffffd0->mWrapV & 1U) != 0) &&
     ((stack0xffffffffffffffd0->mMirrorV & 1U) != 0)) {
    it._M_current._4_4_ = 2;
  }
  aiMaterial::AddProperty
            (mat,(int *)((long)&it._M_current + 4),1,"$tex.mapmodev",name.data._1016_4_,idx);
  aiMaterial::AddProperty
            (mat,&stack0xffffffffffffffd0->mTransform,1,"$tex.uvtrafo",name.data._1016_4_,idx);
  aiMaterial::AddProperty
            (mat,(int *)&stack0xffffffffffffffd0->mOp,1,"$tex.blend",name.data._1016_4_,idx);
  aiMaterial::AddProperty
            (mat,&stack0xffffffffffffffd0->mWeighting,1,"$tex.blend",name.data._1016_4_,idx);
  if (stack0xffffffffffffffd0->mUVId == 0xffffffff) {
    it._M_current._4_4_ = 0xffffffff;
    local_448._M_current = (char *)std::__cxx11::string::begin();
    while( true ) {
      local_450._M_current = (char *)std::__cxx11::string::end();
      bVar1 = __gnu_cxx::operator!=(&local_448,&local_450);
      if (!bVar1) break;
      pcVar2 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_448);
      bVar1 = IsNumeric<char>(*pcVar2);
      if (bVar1) {
        pcVar2 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_448);
        it._M_current._4_4_ = strtoul10(pcVar2,(char **)0x0);
        break;
      }
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&local_448);
    }
    if (it._M_current._4_4_ == 0xffffffff) {
      this_00 = DefaultLogger::get();
      Logger::warn(this_00,"Collada: unable to determine UV channel for texture");
      it._M_current._4_4_ = 0;
    }
  }
  else {
    it._M_current._4_4_ = stack0xffffffffffffffd0->mUVId;
  }
  aiMaterial::AddProperty
            (mat,(int *)((long)&it._M_current + 4),1,"$tex.uvwsrc",name.data._1016_4_,idx);
  return;
}

Assistant:

void ColladaLoader::AddTexture(aiMaterial& mat, const ColladaParser& pParser,
    const Collada::Effect& effect,
    const Collada::Sampler& sampler,
    aiTextureType type, unsigned int idx)
{
    // first of all, basic file name
    const aiString name = FindFilenameForEffectTexture(pParser, effect, sampler.mName);
    mat.AddProperty(&name, _AI_MATKEY_TEXTURE_BASE, type, idx);

    // mapping mode
    int map = aiTextureMapMode_Clamp;
    if (sampler.mWrapU)
        map = aiTextureMapMode_Wrap;
    if (sampler.mWrapU && sampler.mMirrorU)
        map = aiTextureMapMode_Mirror;

    mat.AddProperty(&map, 1, _AI_MATKEY_MAPPINGMODE_U_BASE, type, idx);

    map = aiTextureMapMode_Clamp;
    if (sampler.mWrapV)
        map = aiTextureMapMode_Wrap;
    if (sampler.mWrapV && sampler.mMirrorV)
        map = aiTextureMapMode_Mirror;

    mat.AddProperty(&map, 1, _AI_MATKEY_MAPPINGMODE_V_BASE, type, idx);

    // UV transformation
    mat.AddProperty(&sampler.mTransform, 1,
        _AI_MATKEY_UVTRANSFORM_BASE, type, idx);

    // Blend mode
    mat.AddProperty((int*)&sampler.mOp, 1,
        _AI_MATKEY_TEXBLEND_BASE, type, idx);

    // Blend factor
    mat.AddProperty((ai_real*)&sampler.mWeighting, 1,
        _AI_MATKEY_TEXBLEND_BASE, type, idx);

    // UV source index ... if we didn't resolve the mapping, it is actually just
    // a guess but it works in most cases. We search for the frst occurrence of a
    // number in the channel name. We assume it is the zero-based index into the
    // UV channel array of all corresponding meshes. It could also be one-based
    // for some exporters, but we won't care of it unless someone complains about.
    if (sampler.mUVId != UINT_MAX)
        map = sampler.mUVId;
    else {
        map = -1;
        for (std::string::const_iterator it = sampler.mUVChannel.begin(); it != sampler.mUVChannel.end(); ++it) {
            if (IsNumeric(*it)) {
                map = strtoul10(&(*it));
                break;
            }
        }
        if (-1 == map) {
            ASSIMP_LOG_WARN("Collada: unable to determine UV channel for texture");
            map = 0;
        }
    }
    mat.AddProperty(&map, 1, _AI_MATKEY_UVWSRC_BASE, type, idx);
}